

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

ZCC_Expression * __thiscall
ZCCCompiler::ApplyConversion(ZCCCompiler *this,ZCC_Expression *expr,Conversion **route,int routelen)

{
  ulong uVar1;
  
  if (0 < routelen) {
    uVar1 = 0;
    do {
      if (expr->Operation == PEX_ConstValue) {
        (*route[uVar1]->ConvertConstant)((ZCC_ExprConstant *)expr,&this->AST->Strings);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)routelen != uVar1);
  }
  return expr;
}

Assistant:

ZCC_Expression *ZCCCompiler::ApplyConversion(ZCC_Expression *expr, const PType::Conversion **route, int routelen)
{
	for (int i = 0; i < routelen; ++i)
	{
		if (expr->Operation != PEX_ConstValue)
		{
			expr = AddCastNode(route[i]->TargetType, expr);
		}
		else
		{
			route[i]->ConvertConstant(static_cast<ZCC_ExprConstant *>(expr), AST.Strings);
		}
	}
	return expr;
}